

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O1

void __thiscall
OpenMD::Electrostatic::getSitePotentials
          (Electrostatic *this,Atom *a1,Atom *a2,bool excluded,RealType *spot1,RealType *spot2)

{
  pointer pEVar1;
  pointer pEVar2;
  undefined8 *puVar3;
  double dVar4;
  uint uVar5;
  AtomType *this_00;
  pointer piVar6;
  pointer pEVar7;
  ulong uVar8;
  RealType RVar9;
  RealType RVar10;
  RealType RVar11;
  undefined8 uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined3 uVar18;
  uint i_4;
  int iVar19;
  int iVar20;
  undefined4 uVar21;
  Mat3x3d *pMVar22;
  double *pdVar23;
  Mat3x3d *pMVar24;
  double (*padVar25) [3];
  long lVar26;
  long lVar27;
  double tmp;
  RealType RVar28;
  double dVar29;
  double tmp_2;
  Vector<double,_3U> result;
  RealType rij;
  RectMatrix<double,_3U,_3U> result_3;
  double local_168 [10];
  double local_118;
  double local_110;
  RealType *local_108;
  RealType *local_100;
  double local_f8 [10];
  Vector3d local_a8;
  double local_88 [11];
  
  local_108 = spot1;
  local_100 = spot2;
  if (this->initialized_ == false) {
    initialize(this);
  }
  this_00 = a2->atomType_;
  iVar19 = AtomType::getIdent(a1->atomType_);
  iVar20 = AtomType::getIdent(this_00);
  piVar6 = (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar7 = (this->ElectrostaticMap).
           super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar19 = piVar6[iVar19];
  pEVar1 = pEVar7 + iVar19;
  pEVar2 = pEVar7 + iVar19;
  bVar13 = pEVar2->is_Charge;
  bVar14 = pEVar2->is_Dipole;
  bVar15 = pEVar2->is_Quadrupole;
  bVar16 = pEVar2->is_Fluctuating;
  bVar17 = pEVar2->uses_SlaterIntramolecular;
  uVar18 = *(undefined3 *)&pEVar2->field_0x5;
  RVar28 = pEVar2->fixedCharge;
  RVar9 = pEVar7[iVar19].hardness;
  RVar10 = (&pEVar7[iVar19].hardness)[1];
  pEVar2 = pEVar7 + iVar19;
  uVar21 = *(undefined4 *)&pEVar2->field_0x24;
  RVar11 = *(RealType *)(&pEVar2->slaterN + 2);
  (this->data1).slaterN = pEVar2->slaterN;
  *(undefined4 *)&(this->data1).field_0x24 = uVar21;
  (this->data1).slaterZeta = RVar11;
  (this->data1).hardness = RVar9;
  (this->data1).electronegativity = RVar10;
  (this->data1).is_Charge = bVar13;
  (this->data1).is_Dipole = bVar14;
  (this->data1).is_Quadrupole = bVar15;
  (this->data1).is_Fluctuating = bVar16;
  (this->data1).uses_SlaterIntramolecular = bVar17;
  *(undefined3 *)&(this->data1).field_0x5 = uVar18;
  (this->data1).fixedCharge = RVar28;
  if (&this->data1 != pEVar1) {
    lVar26 = 0;
    do {
      (this->data1).dipole.super_Vector<double,_3U>.data_[lVar26] =
           *(double *)((long)(pEVar1->dipole).super_Vector<double,_3U>.data_ + lVar26 * 8);
      lVar26 = lVar26 + 1;
    } while (lVar26 != 3);
  }
  if (&this->data1 != pEVar1) {
    pMVar24 = &(this->data1).quadrupole;
    pMVar22 = &pEVar1->quadrupole;
    lVar26 = 0;
    do {
      lVar27 = 0;
      do {
        (pMVar24->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar27] =
             *(double *)
              ((long)(pMVar22->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
              + lVar27 * 8);
        lVar27 = lVar27 + 1;
      } while (lVar27 != 3);
      lVar26 = lVar26 + 1;
      pMVar24 = (Mat3x3d *)
                ((pMVar24->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                );
      pMVar22 = (Mat3x3d *)
                ((long)(pMVar22->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_ + 0x18);
    } while (lVar26 != 3);
  }
  iVar19 = piVar6[iVar20];
  pEVar1 = pEVar7 + iVar19;
  pEVar2 = pEVar7 + iVar19;
  bVar13 = pEVar2->is_Charge;
  bVar14 = pEVar2->is_Dipole;
  bVar15 = pEVar2->is_Quadrupole;
  bVar16 = pEVar2->is_Fluctuating;
  bVar17 = pEVar2->uses_SlaterIntramolecular;
  uVar18 = *(undefined3 *)&pEVar2->field_0x5;
  RVar28 = pEVar2->fixedCharge;
  RVar9 = pEVar7[iVar19].hardness;
  RVar10 = (&pEVar7[iVar19].hardness)[1];
  pEVar7 = pEVar7 + iVar19;
  uVar21 = *(undefined4 *)&pEVar7->field_0x24;
  RVar11 = *(RealType *)(&pEVar7->slaterN + 2);
  (this->data2).slaterN = pEVar7->slaterN;
  *(undefined4 *)&(this->data2).field_0x24 = uVar21;
  (this->data2).slaterZeta = RVar11;
  (this->data2).hardness = RVar9;
  (this->data2).electronegativity = RVar10;
  (this->data2).is_Charge = bVar13;
  (this->data2).is_Dipole = bVar14;
  (this->data2).is_Quadrupole = bVar15;
  (this->data2).is_Fluctuating = bVar16;
  (this->data2).uses_SlaterIntramolecular = bVar17;
  *(undefined3 *)&(this->data2).field_0x5 = uVar18;
  (this->data2).fixedCharge = RVar28;
  if (&this->data2 != pEVar1) {
    lVar26 = 0;
    do {
      (this->data2).dipole.super_Vector<double,_3U>.data_[lVar26] =
           *(double *)((long)(pEVar1->dipole).super_Vector<double,_3U>.data_ + lVar26 * 8);
      lVar26 = lVar26 + 1;
    } while (lVar26 != 3);
  }
  if (&this->data2 != pEVar1) {
    pMVar24 = &(this->data2).quadrupole;
    pMVar22 = &pEVar1->quadrupole;
    lVar26 = 0;
    do {
      lVar27 = 0;
      do {
        (pMVar24->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar27] =
             *(double *)
              ((long)(pMVar22->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
              + lVar27 * 8);
        lVar27 = lVar27 + 1;
      } while (lVar27 != 3);
      lVar26 = lVar26 + 1;
      pMVar24 = (Mat3x3d *)
                ((pMVar24->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                );
      pMVar22 = (Mat3x3d *)
                ((long)(pMVar22->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_ + 0x18);
    } while (lVar26 != 3);
  }
  this->Pa = 0.0;
  this->Pb = 0.0;
  lVar27 = (long)(a2->super_StuntDouble).localIndex_;
  lVar26 = *(long *)((long)&(((a2->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData).
                            position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (a2->super_StuntDouble).storage_);
  local_f8[2] = (double)*(undefined8 *)(lVar26 + 0x10 + lVar27 * 0x18);
  pdVar23 = (double *)(lVar26 + lVar27 * 0x18);
  local_f8[0] = *pdVar23;
  local_f8[1] = pdVar23[1];
  lVar27 = (long)(a1->super_StuntDouble).localIndex_;
  lVar26 = *(long *)((long)&(((a1->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData).
                            position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (a1->super_StuntDouble).storage_);
  local_88[2] = *(double *)(lVar26 + 0x10 + lVar27 * 0x18);
  pdVar23 = (double *)(lVar26 + lVar27 * 0x18);
  local_88[0] = *pdVar23;
  local_88[1] = pdVar23[1];
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_168[2] = 0.0;
  lVar26 = 0;
  do {
    local_168[lVar26] = local_f8[lVar26] - local_88[lVar26];
    lVar26 = lVar26 + 1;
  } while (lVar26 != 3);
  local_a8.super_Vector<double,_3U>.data_[2] = local_168[2];
  local_a8.super_Vector<double,_3U>.data_[0] = local_168[0];
  local_a8.super_Vector<double,_3U>.data_[1] = local_168[1];
  Snapshot::wrapVector(this->info_->sman_->currentSnapshot_,&local_a8);
  local_118 = 0.0;
  lVar26 = 0;
  do {
    dVar29 = local_a8.super_Vector<double,_3U>.data_[lVar26];
    local_118 = local_118 + dVar29 * dVar29;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 3);
  if (local_118 < 0.0) {
    local_118 = sqrt(local_118);
  }
  else {
    local_118 = SQRT(local_118);
  }
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_168[2] = 0.0;
  lVar26 = 0;
  do {
    local_168[lVar26] = local_a8.super_Vector<double,_3U>.data_[lVar26] * (1.0 / local_118);
    lVar26 = lVar26 + 1;
  } while (lVar26 != 3);
  (this->rhat).super_Vector<double,_3U>.data_[2] = local_168[2];
  (this->rhat).super_Vector<double,_3U>.data_[0] = local_168[0];
  (this->rhat).super_Vector<double,_3U>.data_[1] = local_168[1];
  if (local_118 < this->cutoffRadius_ && !excluded) {
    uVar5._0_1_ = (this->data1).is_Charge;
    uVar5._1_1_ = (this->data1).is_Dipole;
    uVar5._2_1_ = (this->data1).is_Quadrupole;
    uVar5._3_1_ = (this->data1).is_Fluctuating;
    this->a_is_Charge = (bool)(undefined1)uVar5;
    this->a_is_Dipole = (bool)uVar5._1_1_;
    this->a_is_Quadrupole = (bool)uVar5._2_1_;
    this->a_is_Fluctuating = (bool)uVar5._3_1_;
    uVar8._0_1_ = (this->data2).is_Charge;
    uVar8._1_1_ = (this->data2).is_Dipole;
    uVar8._2_1_ = (this->data2).is_Quadrupole;
    uVar8._3_1_ = (this->data2).is_Fluctuating;
    uVar8._4_1_ = (this->data2).uses_SlaterIntramolecular;
    uVar8._5_3_ = *(undefined3 *)&(this->data2).field_0x5;
    uVar21 = (undefined4)uVar8;
    this->b_is_Charge = (bool)(char)uVar21;
    this->b_is_Dipole = (bool)(char)((uint)uVar21 >> 8);
    this->b_is_Quadrupole = (bool)(char)((uint)uVar21 >> 0x10);
    this->b_is_Fluctuating = (bool)(char)((uint)uVar21 >> 0x18);
    local_110 = 1.0 / local_118;
    if (((uVar5 & 1) != 0) || ((uVar8 & 1) != 0)) {
      RVar28 = CubicSpline::getValueAt
                         ((this->v01s).
                          super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,&local_118);
      this->v01 = RVar28;
    }
    if ((this->a_is_Dipole != false) || (this->b_is_Dipole == true)) {
      RVar28 = CubicSpline::getValueAt
                         ((this->v11s).
                          super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,&local_118);
      this->v11 = RVar28;
      this->v11or = RVar28 * local_110;
    }
    if ((this->a_is_Quadrupole != false) || (this->b_is_Quadrupole == true)) {
      RVar28 = CubicSpline::getValueAt
                         ((this->v21s).
                          super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,&local_118);
      this->v21 = RVar28;
      RVar28 = CubicSpline::getValueAt
                         ((this->v22s).
                          super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,&local_118);
      this->v22 = RVar28;
      this->v22or = local_110 * RVar28;
    }
    if (this->a_is_Charge == true) {
      dVar29 = (this->data1).fixedCharge;
      this->C_a = dVar29;
      if (this->a_is_Fluctuating == true) {
        this->C_a = dVar29 + *(double *)
                              (*(long *)((long)&(((a1->super_StuntDouble).snapshotMan_)->
                                                 currentSnapshot_->atomData).flucQPos.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start +
                                        (a1->super_StuntDouble).storage_) +
                              (long)(a1->super_StuntDouble).localIndex_ * 8);
      }
      this->Pb = this->C_a * this->pre11_ * this->v01 + this->Pb;
    }
    if (this->a_is_Dipole == true) {
      lVar27 = (long)(a1->super_StuntDouble).localIndex_;
      lVar26 = *(long *)((long)&(((a1->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                                .dipole.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                        (a1->super_StuntDouble).storage_);
      local_f8[2] = (double)*(undefined8 *)(lVar26 + 0x10 + lVar27 * 0x18);
      pdVar23 = (double *)(lVar26 + lVar27 * 0x18);
      local_f8[0] = *pdVar23;
      local_f8[1] = pdVar23[1];
      local_168[0] = 0.0;
      local_168[1] = 0.0;
      local_168[2] = 0.0;
      lVar26 = 0;
      do {
        local_168[lVar26] = local_f8[lVar26] * 0.20819434;
        lVar26 = lVar26 + 1;
      } while (lVar26 != 3);
      (this->D_a).super_Vector<double,_3U>.data_[2] = local_168[2];
      (this->D_a).super_Vector<double,_3U>.data_[0] = local_168[0];
      (this->D_a).super_Vector<double,_3U>.data_[1] = local_168[1];
      dVar29 = 0.0;
      lVar26 = 0;
      do {
        dVar29 = dVar29 + (this->rhat).super_Vector<double,_3U>.data_[lVar26] *
                          (this->D_a).super_Vector<double,_3U>.data_[lVar26];
        lVar26 = lVar26 + 1;
      } while (lVar26 != 3);
      this->rdDa = dVar29;
      this->Pb = this->pre12_ * this->v11 * dVar29 + this->Pb;
    }
    if (this->a_is_Quadrupole == true) {
      padVar25 = (double (*) [3])local_88;
      StuntDouble::getQuadrupole((Mat3x3d *)padVar25,&a1->super_StuntDouble);
      pdVar23 = local_f8;
      local_f8[6] = 0.0;
      local_f8[7] = 0.0;
      local_f8[4] = 0.0;
      local_f8[5] = 0.0;
      local_f8[2] = 0.0;
      local_f8[3] = 0.0;
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[8] = 0.0;
      lVar26 = 0;
      do {
        lVar27 = 0;
        do {
          pdVar23[lVar27] =
               (((SquareMatrix<double,_3> *)*padVar25)->super_RectMatrix<double,_3U,_3U>).data_[0]
               [lVar27] * 0.20819434;
          lVar27 = lVar27 + 1;
        } while (lVar27 != 3);
        lVar26 = lVar26 + 1;
        pdVar23 = pdVar23 + 3;
        padVar25 = padVar25 + 1;
      } while (lVar26 != 3);
      lVar26 = 0;
      do {
        *(undefined8 *)((long)local_168 + lVar26 + 0x10) =
             *(undefined8 *)((long)local_f8 + lVar26 + 0x10);
        uVar12 = *(undefined8 *)((long)local_f8 + lVar26 + 8);
        *(undefined8 *)((long)local_168 + lVar26) = *(undefined8 *)((long)local_f8 + lVar26);
        *(undefined8 *)((long)local_168 + lVar26 + 8) = uVar12;
        lVar26 = lVar26 + 0x18;
      } while (lVar26 != 0x48);
      pMVar24 = &this->Q_a;
      lVar26 = 0;
      do {
        *(undefined8 *)
         ((long)(this->Q_a).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
         + lVar26 + 0x10) = *(undefined8 *)((long)local_168 + lVar26 + 0x10);
        uVar12 = *(undefined8 *)((long)local_168 + lVar26 + 8);
        puVar3 = (undefined8 *)
                 ((long)(pMVar24->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar26);
        *puVar3 = *(undefined8 *)((long)local_168 + lVar26);
        puVar3[1] = uVar12;
        lVar26 = lVar26 + 0x18;
      } while (lVar26 != 0x48);
      dVar29 = (this->Q_a).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
               [0] + (this->Q_a).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                     data_[1][1] +
               (this->Q_a).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
               [2];
      this->trQa = dVar29;
      local_168[0] = 0.0;
      local_168[1] = 0.0;
      local_168[2] = 0.0;
      lVar26 = 0;
      do {
        dVar4 = local_168[lVar26];
        lVar27 = 0;
        do {
          dVar4 = dVar4 + (pMVar24->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar27] * (this->rhat).super_Vector<double,_3U>.data_[lVar27];
          lVar27 = lVar27 + 1;
        } while (lVar27 != 3);
        local_168[lVar26] = dVar4;
        lVar26 = lVar26 + 1;
        pMVar24 = (Mat3x3d *)
                  ((pMVar24->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
      } while (lVar26 != 3);
      (this->Qar).super_Vector<double,_3U>.data_[2] = local_168[2];
      (this->Qar).super_Vector<double,_3U>.data_[0] = local_168[0];
      (this->Qar).super_Vector<double,_3U>.data_[1] = local_168[1];
      dVar4 = 0.0;
      lVar26 = 0;
      do {
        dVar4 = dVar4 + (this->rhat).super_Vector<double,_3U>.data_[lVar26] *
                        (this->Qar).super_Vector<double,_3U>.data_[lVar26];
        lVar26 = lVar26 + 1;
      } while (lVar26 != 3);
      this->rdQar = dVar4;
      this->Pb = (dVar29 * this->v21 + dVar4 * this->v22) * this->pre14_ + this->Pb;
    }
    if (this->b_is_Charge == true) {
      dVar29 = (this->data2).fixedCharge;
      this->C_b = dVar29;
      if (this->b_is_Fluctuating == true) {
        this->C_b = dVar29 + *(double *)
                              (*(long *)((long)&(((a2->super_StuntDouble).snapshotMan_)->
                                                 currentSnapshot_->atomData).flucQPos.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start +
                                        (a2->super_StuntDouble).storage_) +
                              (long)(a2->super_StuntDouble).localIndex_ * 8);
      }
      this->Pa = this->C_b * this->pre11_ * this->v01 + this->Pa;
    }
    if (this->b_is_Dipole == true) {
      lVar27 = (long)(a2->super_StuntDouble).localIndex_;
      lVar26 = *(long *)((long)&(((a2->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                                .dipole.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                        (a2->super_StuntDouble).storage_);
      local_f8[2] = (double)*(undefined8 *)(lVar26 + 0x10 + lVar27 * 0x18);
      pdVar23 = (double *)(lVar26 + lVar27 * 0x18);
      local_f8[0] = *pdVar23;
      local_f8[1] = pdVar23[1];
      local_168[0] = 0.0;
      local_168[1] = 0.0;
      local_168[2] = 0.0;
      lVar26 = 0;
      do {
        local_168[lVar26] = local_f8[lVar26] * 0.20819434;
        lVar26 = lVar26 + 1;
      } while (lVar26 != 3);
      (this->D_b).super_Vector<double,_3U>.data_[2] = local_168[2];
      (this->D_b).super_Vector<double,_3U>.data_[0] = local_168[0];
      (this->D_b).super_Vector<double,_3U>.data_[1] = local_168[1];
      dVar29 = 0.0;
      lVar26 = 0;
      do {
        dVar29 = dVar29 + (this->rhat).super_Vector<double,_3U>.data_[lVar26] *
                          (this->D_b).super_Vector<double,_3U>.data_[lVar26];
        lVar26 = lVar26 + 1;
      } while (lVar26 != 3);
      this->rdDb = dVar29;
      this->Pa = this->pre12_ * this->v11 * dVar29 + this->Pa;
    }
    if (this->b_is_Quadrupole == true) {
      padVar25 = (double (*) [3])local_88;
      StuntDouble::getQuadrupole((Mat3x3d *)padVar25,&a2->super_StuntDouble);
      pdVar23 = local_f8;
      local_f8[6] = 0.0;
      local_f8[7] = 0.0;
      local_f8[4] = 0.0;
      local_f8[5] = 0.0;
      local_f8[2] = 0.0;
      local_f8[3] = 0.0;
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[8] = 0.0;
      lVar26 = 0;
      do {
        lVar27 = 0;
        do {
          pdVar23[lVar27] =
               (((SquareMatrix<double,_3> *)*padVar25)->super_RectMatrix<double,_3U,_3U>).data_[0]
               [lVar27] * 0.20819434;
          lVar27 = lVar27 + 1;
        } while (lVar27 != 3);
        lVar26 = lVar26 + 1;
        pdVar23 = pdVar23 + 3;
        padVar25 = padVar25 + 1;
      } while (lVar26 != 3);
      lVar26 = 0;
      do {
        *(undefined8 *)((long)local_168 + lVar26 + 0x10) =
             *(undefined8 *)((long)local_f8 + lVar26 + 0x10);
        uVar12 = *(undefined8 *)((long)local_f8 + lVar26 + 8);
        *(undefined8 *)((long)local_168 + lVar26) = *(undefined8 *)((long)local_f8 + lVar26);
        *(undefined8 *)((long)local_168 + lVar26 + 8) = uVar12;
        lVar26 = lVar26 + 0x18;
      } while (lVar26 != 0x48);
      lVar26 = 0;
      do {
        *(undefined8 *)
         ((long)(this->Q_a).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
         + lVar26 + 0x10) = *(undefined8 *)((long)local_168 + lVar26 + 0x10);
        uVar12 = *(undefined8 *)((long)local_168 + lVar26 + 8);
        puVar3 = (undefined8 *)
                 ((long)(this->Q_a).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar26);
        *puVar3 = *(undefined8 *)((long)local_168 + lVar26);
        puVar3[1] = uVar12;
        lVar26 = lVar26 + 0x18;
      } while (lVar26 != 0x48);
      pMVar24 = &this->Q_b;
      dVar29 = (this->Q_b).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
               [0] + (this->Q_b).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                     data_[1][1] +
               (this->Q_b).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
               [2];
      this->trQb = dVar29;
      local_168[0] = 0.0;
      local_168[1] = 0.0;
      local_168[2] = 0.0;
      lVar26 = 0;
      do {
        dVar4 = local_168[lVar26];
        lVar27 = 0;
        do {
          dVar4 = dVar4 + (pMVar24->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar27] * (this->rhat).super_Vector<double,_3U>.data_[lVar27];
          lVar27 = lVar27 + 1;
        } while (lVar27 != 3);
        local_168[lVar26] = dVar4;
        lVar26 = lVar26 + 1;
        pMVar24 = (Mat3x3d *)
                  ((pMVar24->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
      } while (lVar26 != 3);
      (this->Qbr).super_Vector<double,_3U>.data_[2] = local_168[2];
      (this->Qbr).super_Vector<double,_3U>.data_[0] = local_168[0];
      (this->Qbr).super_Vector<double,_3U>.data_[1] = local_168[1];
      dVar4 = 0.0;
      lVar26 = 0;
      do {
        dVar4 = dVar4 + (this->rhat).super_Vector<double,_3U>.data_[lVar26] *
                        (this->Qbr).super_Vector<double,_3U>.data_[lVar26];
        lVar26 = lVar26 + 1;
      } while (lVar26 != 3);
      this->rdQbr = dVar4;
      this->Pa = (dVar29 * this->v21 + dVar4 * this->v22) * this->pre14_ + this->Pa;
    }
    *local_108 = this->Pa;
    RVar28 = this->Pb;
  }
  else {
    *local_108 = 0.0;
    RVar28 = 0.0;
  }
  *local_100 = RVar28;
  return;
}

Assistant:

void Electrostatic::getSitePotentials(Atom* a1, Atom* a2, bool excluded,
                                        RealType& spot1, RealType& spot2) {
    if (!initialized_) { initialize(); }

    const RealType mPoleConverter = 0.20819434;

    AtomType* atype1 = a1->getAtomType();
    AtomType* atype2 = a2->getAtomType();
    int atid1        = atype1->getIdent();
    int atid2        = atype2->getIdent();
    data1            = ElectrostaticMap[Etids[atid1]];
    data2            = ElectrostaticMap[Etids[atid2]];

    Pa = 0.0;  // Site potential at site a
    Pb = 0.0;  // Site potential at site b

    Vector3d d = a2->getPos() - a1->getPos();
    info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(d);
    RealType rij = d.length();
    // some variables we'll need independent of electrostatic type:

    RealType ri = 1.0 / rij;
    rhat        = d * ri;

    if ((rij >= cutoffRadius_) || excluded) {
      spot1 = 0.0;
      spot2 = 0.0;
      return;
    }

    // logicals

    a_is_Charge      = data1.is_Charge;
    a_is_Dipole      = data1.is_Dipole;
    a_is_Quadrupole  = data1.is_Quadrupole;
    a_is_Fluctuating = data1.is_Fluctuating;

    b_is_Charge      = data2.is_Charge;
    b_is_Dipole      = data2.is_Dipole;
    b_is_Quadrupole  = data2.is_Quadrupole;
    b_is_Fluctuating = data2.is_Fluctuating;

    // Obtain all of the required radial function values from the
    // spline structures:

    if (a_is_Charge || b_is_Charge) { v01 = v01s->getValueAt(rij); }
    if (a_is_Dipole || b_is_Dipole) {
      v11   = v11s->getValueAt(rij);
      v11or = ri * v11;
    }
    if (a_is_Quadrupole || b_is_Quadrupole) {
      v21   = v21s->getValueAt(rij);
      v22   = v22s->getValueAt(rij);
      v22or = ri * v22;
    }

    if (a_is_Charge) {
      C_a = data1.fixedCharge;

      if (a_is_Fluctuating) { C_a += a1->getFlucQPos(); }

      Pb += C_a * pre11_ * v01;
    }

    if (a_is_Dipole) {
      D_a  = a1->getDipole() * mPoleConverter;
      rdDa = dot(rhat, D_a);
      Pb += pre12_ * v11 * rdDa;
    }

    if (a_is_Quadrupole) {
      Q_a   = a1->getQuadrupole() * mPoleConverter;
      trQa  = Q_a.trace();
      Qar   = Q_a * rhat;
      rdQar = dot(rhat, Qar);
      Pb += pre14_ * (v21 * trQa + v22 * rdQar);
    }

    if (b_is_Charge) {
      C_b = data2.fixedCharge;

      if (b_is_Fluctuating) C_b += a2->getFlucQPos();

      Pa += C_b * pre11_ * v01;
    }

    if (b_is_Dipole) {
      D_b  = a2->getDipole() * mPoleConverter;
      rdDb = dot(rhat, D_b);
      Pa += pre12_ * v11 * rdDb;
    }

    if (b_is_Quadrupole) {
      Q_a   = a2->getQuadrupole() * mPoleConverter;
      trQb  = Q_b.trace();
      Qbr   = Q_b * rhat;
      rdQbr = dot(rhat, Qbr);
      Pa += pre14_ * (v21 * trQb + v22 * rdQbr);
    }

    spot1 = Pa;
    spot2 = Pb;
  }